

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O2

void __thiscall Excel::Stream::read<long>(Stream *this,long *retVal,int32_t bytes)

{
  uint uVar1;
  int iVar2;
  Exception *this_00;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  allocator local_51;
  wstring local_50;
  
  *retVal = 0;
  uVar1 = 8;
  if (bytes != 0) {
    uVar1 = bytes;
  }
  lVar6 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  iVar5 = uVar1 * 8;
  while( true ) {
    iVar5 = iVar5 + -8;
    if (uVar4 * 8 == lVar6) {
      return;
    }
    uVar1 = (*this->_vptr_Stream[2])(this);
    iVar2 = (*this->_vptr_Stream[3])(this);
    if ((char)iVar2 != '\0') break;
    bVar3 = (byte)iVar5;
    if (this->m_byteOrder == (uint)(*SystemByteOrder::byteOrder()::byte != '\0')) {
      bVar3 = (byte)lVar6;
    }
    *retVal = *retVal | (ulong)(uVar1 & 0xff) << (bVar3 & 0x3f);
    lVar6 = lVar6 + 8;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  std::__cxx11::wstring::wstring((wstring *)&local_50,L"Unexpected end of file.",&local_51);
  Exception::Exception(this_00,&local_50);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void read( Type & retVal, int32_t bytes = 0 )
	{
		retVal = Type(0);
		if( bytes == 0 ) bytes = sizeof( Type );

		for( int32_t i = 0; i < bytes; ++i )
		{
			Type c = (Type)(unsigned char) getByte();

			if( eof() )
				throw Exception( L"Unexpected end of file." );

			if( SystemByteOrder::byteOrder() != m_byteOrder )
				retVal |= ( c << 8 * ( bytes - i - 1 ) );
			else
				retVal |= ( c << 8 * i );
		}
	}